

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

void __thiscall Builder::~Builder(Builder *this)

{
  Cleanup(this);
  std::
  _Rb_tree<const_Edge_*,_std::pair<const_Edge_*const,_int>,_std::_Select1st<std::pair<const_Edge_*const,_int>_>,_std::less<const_Edge_*>,_std::allocator<std::pair<const_Edge_*const,_int>_>_>
  ::~_Rb_tree(&(this->running_edges_)._M_t);
  std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::~unique_ptr
            (&this->command_runner_);
  Plan::~Plan(&this->plan_);
  return;
}

Assistant:

Builder::~Builder() {
  Cleanup();
}